

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

void sk_net_close(Socket *sock)

{
  Socket *e;
  undefined8 in_RAX;
  
  e = sock + -0x12;
  if (sock[-1].vt != (SocketVtable *)0x0) {
    sk_net_close((Socket *)&sock[-1].vt[2].write);
  }
  bufchain_clear((bufchain *)(sock + -0xf));
  del234(sktree,e);
  if (-1 < *(int *)&sock[-0x11].vt) {
    uxsel_del((int)((ulong)in_RAX >> 0x20));
    close(*(int *)&sock[-0x11].vt);
  }
  if ((SockAddr *)sock[-5].vt != (SockAddr *)0x0) {
    sk_addr_free((SockAddr *)sock[-5].vt);
  }
  delete_callbacks_for_context(e);
  safefree(e);
  return;
}

Assistant:

static void sk_net_close(Socket *sock)
{
    NetSocket *s = container_of(sock, NetSocket, sock);

    if (s->child)
        sk_net_close(&s->child->sock);

    bufchain_clear(&s->output_data);

    del234(sktree, s);
    if (s->s >= 0) {
        uxsel_del(s->s);
        close(s->s);
    }
    if (s->addr)
        sk_addr_free(s->addr);
    delete_callbacks_for_context(s);
    sfree(s);
}